

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldGenerator::GenerateInterfaceMembers
          (RepeatedImmutableEnumFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_GETTER,false);
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "$deprecation$java.util.List<$type$> get$capitalized_name$List();\n");
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_COUNT,false);
  io::Printer::Print(printer,variables,"$deprecation$int get$capitalized_name$Count();\n");
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_INDEXED_GETTER,false);
  io::Printer::Print(printer,variables,"$deprecation$$type$ get$capitalized_name$(int index);\n");
  if (*(char *)(*(long *)(this->descriptor_ + 0x10) + 0x3a) == '\x03') {
    WriteFieldEnumValueAccessorDocComment(printer,this->descriptor_,LIST_GETTER,false);
    io::Printer::Print(printer,variables,
                       "$deprecation$java.util.List<java.lang.Integer>\nget$capitalized_name$ValueList();\n"
                      );
    WriteFieldEnumValueAccessorDocComment(printer,this->descriptor_,LIST_INDEXED_GETTER,false);
    io::Printer::Print(printer,variables,"$deprecation$int get$capitalized_name$Value(int index);\n"
                      );
    return;
  }
  return;
}

Assistant:

void RepeatedImmutableEnumFieldGenerator::GenerateInterfaceMembers(
    io::Printer* printer) const {
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER);
  printer->Print(
      variables_,
      "$deprecation$java.util.List<$type$> get$capitalized_name$List();\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_COUNT);
  printer->Print(variables_,
                 "$deprecation$int get$capitalized_name$Count();\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_GETTER);
  printer->Print(variables_,
                 "$deprecation$$type$ get$capitalized_name$(int index);\n");
  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, LIST_GETTER);
    printer->Print(variables_,
                   "$deprecation$java.util.List<java.lang.Integer>\n"
                   "get$capitalized_name$ValueList();\n");
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_,
                                          LIST_INDEXED_GETTER);
    printer->Print(variables_,
                   "$deprecation$int get$capitalized_name$Value(int index);\n");
  }
}